

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

Node * __thiscall anon_unknown.dwarf_4161a3::Db::parseDestructorName(Db *this)

{
  char cVar1;
  int iVar2;
  Node *local_20;
  Node *Result;
  Db *this_local;
  
  Result = (Node *)this;
  cVar1 = look(this,0);
  iVar2 = isdigit((int)cVar1);
  if (iVar2 == 0) {
    local_20 = parseUnresolvedType(this);
  }
  else {
    local_20 = parseSimpleId(this);
  }
  if (local_20 == (Node *)0x0) {
    this_local = (Db *)0x0;
  }
  else {
    this_local = (Db *)(anonymous_namespace)::Db::
                       make<(anonymous_namespace)::DtorName,(anonymous_namespace)::Node*&>
                                 ((Db *)this,&local_20);
  }
  return (Node *)this_local;
}

Assistant:

Node *Db::parseDestructorName() {
  Node *Result;
  if (std::isdigit(look()))
    Result = parseSimpleId();
  else
    Result = parseUnresolvedType();
  if (Result == nullptr)
    return nullptr;
  return make<DtorName>(Result);
}